

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_IterateLevels(ktxTexture2 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktxTexture2_private *pkVar1;
  ktx_uint64_t kVar2;
  ktx_uint64_t kVar3;
  byte bVar4;
  undefined8 in_RDX;
  code *in_RSI;
  ktxTexture2 *in_RDI;
  ktx_uint64_t offset;
  ktx_uint64_t levelSize;
  ktx_uint32_t depth;
  ktx_uint32_t height;
  ktx_uint32_t width;
  ktx_int32_t level;
  ktxLevelIndexEntry *levelIndex;
  ktx_error_code_e result;
  uint local_5c;
  uint local_58;
  uint local_54;
  ktx_uint32_t local_34;
  ktx_error_code_e local_24;
  ktx_error_code_e local_4;
  
  local_24 = KTX_SUCCESS;
  pkVar1 = in_RDI->_private;
  if (in_RDI == (ktxTexture2 *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (in_RSI == (code *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (in_RDI->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
    local_34 = in_RDI->numLevels;
    do {
      local_34 = local_34 - 1;
      if ((int)local_34 < 0) break;
      bVar4 = (byte)local_34;
      if (in_RDI->baseWidth >> (bVar4 & 0x1f) == 0) {
        local_54 = 1;
      }
      else {
        local_54 = in_RDI->baseWidth >> (bVar4 & 0x1f);
      }
      if (in_RDI->baseHeight >> (bVar4 & 0x1f) == 0) {
        local_58 = 1;
      }
      else {
        local_58 = in_RDI->baseHeight >> (bVar4 & 0x1f);
      }
      if (in_RDI->baseDepth >> (bVar4 & 0x1f) == 0) {
        local_5c = 1;
      }
      else {
        local_5c = in_RDI->baseDepth >> (bVar4 & 0x1f);
      }
      kVar2 = pkVar1->_levelIndex[(int)local_34].uncompressedByteLength;
      kVar3 = ktxTexture2_levelDataOffset(in_RDI,local_34);
      local_24 = (*in_RSI)(local_34,0,local_54,local_58,local_5c,kVar2,in_RDI->pData + kVar3,in_RDX)
      ;
    } while (local_24 == KTX_SUCCESS);
    local_4 = local_24;
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_IterateLevels(ktxTexture2* This, PFNKTXITERCB iterCb, void* userdata)
{
    KTX_error_code  result = KTX_SUCCESS;
    //ZSTD_DCtx* dctx;
    //ktx_uint8_t* decompBuf;
    ktxLevelIndexEntry* levelIndex = This->_private->_levelIndex;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; level--)
    {
        ktx_uint32_t width, height, depth;
        ktx_uint64_t levelSize;
        ktx_uint64_t offset;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> level);
        height = MAX(1, This->baseHeight >> level);
        depth = MAX(1, This->baseDepth  >> level);

        levelSize = levelIndex[level].uncompressedByteLength;
        offset = ktxTexture2_levelDataOffset(This, level);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        result = iterCb(level, 0, width, height, depth,
                        levelSize, This->pData + offset, userdata);
        if (result != KTX_SUCCESS)
            break;
    }

    return result;
}